

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaUtil.c
# Opt level: O2

char * Ioa_FileNameGenericAppend(char *pBase,char *pSuffix)

{
  byte bVar1;
  char *pcVar2;
  size_t sVar3;
  byte *pbVar4;
  
  if (pBase != (char *)0x0) {
    strcpy(Ioa_FileNameGenericAppend::Buffer,pBase);
    pcVar2 = strrchr(Ioa_FileNameGenericAppend::Buffer,0x2e);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
    }
    strcat(Ioa_FileNameGenericAppend::Buffer,pSuffix);
    sVar3 = strlen(Ioa_FileNameGenericAppend::Buffer);
    for (pbVar4 = &DAT_00cbbabf + sVar3;
        (&DAT_00cbbabf < pbVar4 &&
        ((((bVar1 = *pbVar4, (byte)(bVar1 - 0x30) < 10 || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          (bVar1 == 0x5f)) || (bVar1 == 0x2e)))); pbVar4 = pbVar4 + -1) {
    }
    return (char *)(pbVar4 + 1);
  }
  pcVar2 = strcpy(Ioa_FileNameGenericAppend::Buffer,pSuffix);
  return pcVar2;
}

Assistant:

char * Ioa_FileNameGenericAppend( char * pBase, char * pSuffix )
{
    static char Buffer[1000];
    char * pDot;
    if ( pBase == NULL )
    {
        strcpy( Buffer, pSuffix );
        return Buffer;
    }
    strcpy( Buffer, pBase );
    if ( (pDot = strrchr( Buffer, '.' )) )
        *pDot = 0;
    strcat( Buffer, pSuffix );
    // find the last occurrance of slash
    for ( pDot = Buffer + strlen(Buffer) - 1; pDot >= Buffer; pDot-- )    
        if (!((*pDot >= '0' && *pDot <= '9') ||
              (*pDot >= 'a' && *pDot <= 'z') ||
              (*pDot >= 'A' && *pDot <= 'Z') || 
               *pDot == '_' || *pDot == '.') )
               break;
    return pDot + 1;
}